

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestGateway::export_(TestGateway *this,ExportContext context)

{
  long *plVar1;
  undefined8 uVar2;
  Disposer *pDVar3;
  RequestHook *pRVar4;
  undefined4 uVar5;
  TransformPromiseNodeBase *this_00;
  WirePointer *pWVar6;
  _func_int **in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar7;
  int in_R8D;
  CapTableBuilder *pCVar8;
  Promise<void> PVar9;
  Client cap;
  undefined1 local_e8 [16];
  undefined8 uStack_d8;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_d0;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_98;
  undefined1 local_58 [32];
  Maybe<capnp::MessageSize> local_38;
  
  (**(code **)*in_RDX)(local_58);
  local_98.super_Builder._builder.data = (void *)local_58._16_8_;
  local_98.super_Builder._builder.pointers = (WirePointer *)local_58._24_8_;
  pCVar8 = (CapTableBuilder *)0x0;
  PointerReader::getStruct((StructReader *)&local_d0,(PointerReader *)&local_98,(word *)0x0);
  if (local_d0.super_Builder._builder.pointerCount == 0) {
    uVar5 = 0x7fffffff;
    pWVar6 = (WirePointer *)0x0;
    local_98.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  }
  else {
    pWVar6 = local_d0.super_Builder._builder.pointers;
    local_98.super_Builder._builder.segment = local_d0.super_Builder._builder.segment;
    pCVar8 = local_d0.super_Builder._builder.capTable;
    uVar5 = local_d0.hook.disposer._0_4_;
  }
  local_98.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_98.super_Builder._builder.pointers._4_4_,uVar5);
  local_98.super_Builder._builder.capTable = pCVar8;
  local_98.super_Builder._builder.data = pWVar6;
  PointerReader::getCapability((PointerReader *)local_58);
  local_e8._8_4_ = local_58._0_4_;
  local_e8._12_4_ = local_58._4_4_;
  uStack_d8 = (long *)CONCAT44(local_58._12_4_,local_58._8_4_);
  local_e8._0_8_ =
       &Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::Client::typeinfo;
  (**(code **)(*in_RDX + 8))();
  local_38.ptr.isSet = false;
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::saveRequest
            (&local_98,(Client *)local_e8,&local_38);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::send(&local_d0,(int)&local_98,__buf,(size_t)pWVar6,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_d0,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1087:15),_kj::_::PropagateException>
             ::anon_class_8_1_bc11688f_for_func::operator());
  pDVar3 = local_d0.hook.disposer;
  uVar2 = local_d0.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00632a78;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RDX;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>,capnp::_::(anonymous_namespace)::TestGateway::export_(capnp::CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>)::{lambda(capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>)#1},kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  pPVar7 = extraout_RDX;
  if (local_d0.super_Builder._builder._32_8_ != 0) {
    local_d0.super_Builder._builder.dataSize = 0;
    local_d0.super_Builder._builder.pointerCount = 0;
    local_d0.super_Builder._builder._38_2_ = 0;
    local_d0.hook.disposer = (Disposer *)0x0;
    (**(local_d0.hook.ptr)->_vptr_RequestHook)(local_d0.hook.ptr,uVar2,8,pDVar3,pDVar3,0);
    pPVar7 = extraout_RDX_00;
  }
  pWVar6 = local_d0.super_Builder._builder.pointers;
  if (local_d0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_d0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_d0.super_Builder._builder.data)
              (local_d0.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
    pPVar7 = extraout_RDX_01;
  }
  pCVar8 = local_d0.super_Builder._builder.capTable;
  if (local_d0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_d0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_d0.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_d0.super_Builder._builder.segment,
               (pCVar8->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar8->super_CapTableReader);
    pPVar7 = extraout_RDX_02;
  }
  pRVar4 = local_98.hook.ptr;
  if (local_98.hook.ptr != (RequestHook *)0x0) {
    local_98.hook.ptr = (RequestHook *)0x0;
    (**(local_98.hook.disposer)->_vptr_Disposer)
              (local_98.hook.disposer,
               pRVar4->_vptr_RequestHook[-2] + (long)&pRVar4->_vptr_RequestHook);
    pPVar7 = extraout_RDX_03;
  }
  plVar1 = uStack_d8;
  if (uStack_d8 != (long *)0x0) {
    uStack_d8 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_e8._12_4_,local_e8._8_4_))
              ((undefined8 *)CONCAT44(local_e8._12_4_,local_e8._8_4_),
               (long)plVar1 + *(long *)(*plVar1 + -0x10));
    pPVar7 = extraout_RDX_04;
  }
  PVar9.super_PromiseBase.node.ptr = pPVar7;
  PVar9.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar9.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> export_(ExportContext context) override {
    auto cap = context.getParams().getCap();
    context.releaseParams();
    return cap.saveRequest().send()
        .then([KJ_CPCAP(context)]
            (Response<Persistent<test::TestSturdyRef>::SaveResults> response) mutable {
      context.getResults().setSturdyRef(kj::str("exported-",
          response.getSturdyRef().getObjectId().getAs<Text>()));
    });
  }